

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perlin.h
# Opt level: O2

void __thiscall perlin::perlin(perlin *this)

{
  double *pdVar1;
  vec3 *pvVar2;
  int *piVar3;
  long lVar4;
  double dVar5;
  double local_38;
  double dStack_30;
  double local_28;
  
  pvVar2 = (vec3 *)operator_new__(0x1800);
  memset(pvVar2,0,0x1800);
  this->ranvec = pvVar2;
  for (lVar4 = 0x10; lVar4 != 0x1810; lVar4 = lVar4 + 0x18) {
    vec3::random();
    pvVar2 = this->ranvec;
    dVar5 = 1.0 / SQRT(local_28 * local_28 + local_38 * local_38 + dStack_30 * dStack_30);
    pdVar1 = (double *)((long)pvVar2->e + lVar4 + -0x10);
    *pdVar1 = dVar5 * local_38;
    pdVar1[1] = dVar5 * dStack_30;
    *(double *)((long)pvVar2->e + lVar4) = local_28 * dVar5;
  }
  piVar3 = perlin_generate_perm();
  this->perm_x = piVar3;
  piVar3 = perlin_generate_perm();
  this->perm_y = piVar3;
  piVar3 = perlin_generate_perm();
  this->perm_z = piVar3;
  return;
}

Assistant:

perlin() {
        ranvec = new vec3[point_count];
        for (int i = 0; i < point_count; ++i) {
            ranvec[i] = unit_vector(vec3::random(-1, 1));
        }

        perm_x = perlin_generate_perm();
        perm_y = perlin_generate_perm();
        perm_z = perlin_generate_perm();
    }